

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

void reportOption(FILE *file,HighsLogOptions *log_options,OptionRecordDouble *option,
                 bool report_only_deviations,HighsFileType file_type)

{
  undefined7 in_register_00000009;
  string *this;
  string line;
  string local_80;
  string local_60;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000009,report_only_deviations) != 0) {
    if ((option->default_value == *option->value) &&
       (!NAN(option->default_value) && !NAN(*option->value))) {
      return;
    }
  }
  if (file_type == kFull) {
    fprintf((FILE *)file,"\n# %s\n",(option->super_OptionRecord).description._M_dataplus._M_p);
    highsBoolToString_abi_cxx11_(&line,(option->super_OptionRecord).advanced,2);
    fprintf((FILE *)file,"# [type: double, advanced: %s, range: [%g, %g], default: %g]\n",
            option->lower_bound,option->upper_bound,option->default_value,line._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&line);
    fprintf((FILE *)file,"%s = %g\n",*option->value,
            (option->super_OptionRecord).name._M_dataplus._M_p);
  }
  else {
    if (file_type == kMd) {
      std::__cxx11::string::string((string *)&local_60,(string *)&(option->super_OptionRecord).name)
      ;
      highsInsertMdEscapes(&line,&local_60);
      std::__cxx11::string::string
                ((string *)&local_80,(string *)&(option->super_OptionRecord).description);
      highsInsertMdEscapes(&local_40,&local_80);
      fprintf((FILE *)file,"## %s\n- %s\n- Type: double\n- Range: [%g, %g]\n- Default: %g\n\n",
              option->lower_bound,option->upper_bound,option->default_value,line._M_dataplus._M_p,
              local_40._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&line);
      this = &local_60;
    }
    else {
      highsFormatToString_abi_cxx11_
                (&line,"Set option %s to %g\n",*option->value,
                 (option->super_OptionRecord).name._M_dataplus._M_p);
      if (_stdout == file) {
        highsLogUser(log_options,kInfo,"%s");
      }
      else {
        fputs(line._M_dataplus._M_p,(FILE *)file);
      }
      this = &line;
    }
    std::__cxx11::string::~string((string *)this);
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordDouble& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(
          file,
          "## %s\n- %s\n- Type: double\n- Range: [%g, %g]\n- Default: %g\n\n",
          highsInsertMdEscapes(option.name).c_str(),
          highsInsertMdEscapes(option.description).c_str(), option.lower_bound,
          option.upper_bound, option.default_value);
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(file,
              "# [type: double, advanced: %s, range: [%g, %g], default: %g]\n",
              highsBoolToString(option.advanced).c_str(), option.lower_bound,
              option.upper_bound, option.default_value);
      fprintf(file, "%s = %g\n", option.name.c_str(), *option.value);
    } else {
      std::string line = highsFormatToString(
          "Set option %s to %g\n", option.name.c_str(), *option.value);
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}